

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodeSetPtr xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1,xmlNodeSetPtr set2)

{
  xmlNodePtr pxVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (0 < set2->nodeNr) {
    iVar2 = set1->nodeNr;
    lVar4 = 0;
    do {
      pxVar1 = set2->nodeTab[lVar4];
      if (set1->nodeMax <= iVar2) {
        iVar2 = xmlXPathNodeSetGrow(set1);
        if (iVar2 < 0) {
          xmlXPathFreeNodeSet(set1);
          xmlXPathNodeSetClearFromPos(set2,0,1);
          return (xmlNodeSetPtr)0x0;
        }
        iVar2 = set1->nodeNr;
      }
      lVar3 = (long)iVar2;
      iVar2 = iVar2 + 1;
      set1->nodeNr = iVar2;
      set1->nodeTab[lVar3] = pxVar1;
      set2->nodeTab[lVar4] = (xmlNodePtr)0x0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < set2->nodeNr);
  }
  set2->nodeNr = 0;
  return set1;
}

Assistant:

static xmlNodeSetPtr
xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1, xmlNodeSetPtr set2)
{
    {
	int i;
	xmlNodePtr n2;

	for (i = 0;i < set2->nodeNr;i++) {
	    n2 = set2->nodeTab[i];
            if (set1->nodeNr >= set1->nodeMax) {
                if (xmlXPathNodeSetGrow(set1) < 0)
                    goto error;
            }
	    set1->nodeTab[set1->nodeNr++] = n2;
            set2->nodeTab[i] = NULL;
	}
    }
    set2->nodeNr = 0;
    return(set1);

error:
    xmlXPathFreeNodeSet(set1);
    xmlXPathNodeSetClear(set2, 1);
    return(NULL);
}